

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void Instruction::clear(void)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_18;
  iterator ed;
  iterator it;
  
  ed = std::
       map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
       ::begin(&m_instrsMap);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
       ::end(&m_instrsMap);
  while( true ) {
    bVar1 = std::operator!=(&ed,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Instruction_*>_>::operator->(&ed)
    ;
    if (ppVar2->second != (Instruction *)0x0) {
      (*ppVar2->second->_vptr_Instruction[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Instruction_*>_>::operator++(&ed,0);
  }
  return;
}

Assistant:

void Instruction::clear() {
	for (std::map<Addr, Instruction*>::iterator it = m_instrsMap.begin(),
			ed = m_instrsMap.end(); it != ed; it++) {
		delete it->second;
	}
}